

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_integer_test.cc
# Opt level: O0

void __thiscall AomLeb128_DecodeTest_Test::TestBody(AomLeb128_DecodeTest_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_t length;
  uint64_t value;
  size_t expected_length;
  uint64_t expected_value;
  uint8_t leb128_bytes [3];
  size_t num_leb128_bytes;
  AssertHelper *in_stack_fffffffffffffe90;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  char *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  int iVar2;
  uint64_t *value_00;
  char *in_stack_fffffffffffffeb0;
  AssertionResult *this_01;
  Type in_stack_fffffffffffffebc;
  Type type;
  AssertHelper *in_stack_fffffffffffffec0;
  Message *in_stack_ffffffffffffff08;
  AssertHelper *in_stack_ffffffffffffff10;
  AssertionResult local_e8 [2];
  AssertionResult local_c8 [2];
  AssertionResult local_a8 [2];
  AssertionResult local_88;
  uint local_74;
  undefined4 local_50;
  int local_4c;
  AssertionResult local_48;
  size_t local_38;
  uint64_t local_30 [3];
  uint8_t local_14 [4];
  undefined8 local_10;
  
  local_10 = 3;
  local_14[2] = 0x26;
  local_14[0] = 0xe5;
  local_14[1] = 0x8e;
  local_30[2] = 0x98765;
  local_30[1] = 3;
  local_30[0] = 0xffffffffffffffff;
  local_4c = aom_uleb_decode(local_14,3,local_30,&local_38);
  local_50 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
             (int *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
             (int *)in_stack_fffffffffffffe90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_48);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffec0);
    testing::AssertionResult::failure_message((AssertionResult *)0x3ad709);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb0,
               (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe90);
    testing::Message::~Message((Message *)0x3ad766);
  }
  local_74 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ad7d1);
  if (local_74 == 0) {
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
               (unsigned_long *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
               (unsigned_long *)in_stack_fffffffffffffe90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffec0);
      testing::AssertionResult::failure_message((AssertionResult *)0x3ad879);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb0,
                 (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe90);
      testing::Message::~Message((Message *)0x3ad8d6);
    }
    local_74 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ad941);
    if (local_74 == 0) {
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                 (unsigned_long *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 (unsigned_long *)in_stack_fffffffffffffe90);
      iVar2 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffec0);
        in_stack_fffffffffffffec0 =
             (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x3ad9e9);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb0,
                   iVar2,in_stack_fffffffffffffea0);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe90);
        testing::Message::~Message((Message *)0x3ada46);
      }
      local_74 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3adab4);
      if (local_74 == 0) {
        value_00 = local_30;
        aom_uleb_decode(local_14,4,value_00,&local_38);
        this_01 = local_c8;
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                  ((char *)value_00,in_stack_fffffffffffffea0,
                   (unsigned_long *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                   (unsigned_long *)in_stack_fffffffffffffe90);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
        type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffebc);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffec0);
          in_stack_fffffffffffffea0 =
               testing::AssertionResult::failure_message((AssertionResult *)0x3adb80);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffec0,type,&this_01->success_,
                     (int)((ulong)value_00 >> 0x20),in_stack_fffffffffffffea0);
          testing::internal::AssertHelper::operator=
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe90);
          testing::Message::~Message((Message *)0x3adbdd);
        }
        local_74 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3adc48);
        if (local_74 == 0) {
          this_00 = local_e8;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                    ((char *)value_00,in_stack_fffffffffffffea0,
                     (unsigned_long *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                     (unsigned_long *)this_00);
          iVar2 = (int)((ulong)value_00 >> 0x20);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffec0);
            testing::AssertionResult::failure_message((AssertionResult *)0x3adcf0);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffec0,type,&this_01->success_,iVar2,
                       in_stack_fffffffffffffea0);
            testing::internal::AssertHelper::operator=
                      (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
            testing::Message::~Message((Message *)0x3add4b);
          }
          local_74 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3addb6);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(AomLeb128, DecodeTest) {
  const size_t num_leb128_bytes = 3;
  const uint8_t leb128_bytes[num_leb128_bytes] = { 0xE5, 0x8E, 0x26 };
  const uint64_t expected_value = 0x98765;  // 624485
  const size_t expected_length = 3;
  uint64_t value = ~0ULL;  // make sure value is cleared by the function
  size_t length;
  ASSERT_EQ(
      aom_uleb_decode(&leb128_bytes[0], num_leb128_bytes, &value, &length), 0);
  ASSERT_EQ(expected_value, value);
  ASSERT_EQ(expected_length, length);

  // Make sure the decoder stops on the last marked LEB128 byte.
  aom_uleb_decode(&leb128_bytes[0], num_leb128_bytes + 1, &value, &length);
  ASSERT_EQ(expected_value, value);
  ASSERT_EQ(expected_length, length);
}